

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

void prepare_next_level(player *p)

{
  ushort uVar1;
  object **ppoVar2;
  loc grid;
  player_upkeep *ppVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  object *obj;
  chunk_conflict *pcVar9;
  level_conflict *plVar10;
  connector *pcVar11;
  chunk_conflict2 *pcVar12;
  loc_conflict lVar13;
  loc lVar14;
  square *psVar15;
  int iVar16;
  wchar_t height;
  int iVar17;
  int x;
  wchar_t wVar18;
  ulong uVar19;
  artifact *artifact;
  int iVar20;
  int y;
  char cVar21;
  wchar_t width;
  int iVar22;
  bool bVar23;
  char new_name [80];
  char prev_name [80];
  char local_d8 [80];
  char local_88 [88];
  
  cVar21 = '\x01';
  if ((p->opts).opt[0x2a] == false) {
    cVar21 = p->upkeep->arena_level;
  }
  pcVar8 = level_name(world->levels + p->last_place);
  my_strcpy(local_88,pcVar8,0x50);
  pcVar8 = level_name(world->levels + p->place);
  my_strcpy(local_d8,pcVar8,0x50);
  pcVar9 = cave;
  if (character_dungeon == true) {
    if (p->cave == (chunk_conflict2 *)0x0) {
      __assert_fail("p->cave",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                    ,0x6a4,"void prepare_next_level(struct player *)");
    }
    if (cVar21 == '\0') {
      if ((cave->depth == 0) &&
         (pcVar9 = chunk_find_name(local_88), pcVar9 == (chunk_conflict *)0x0)) {
        cave_store((chunk *)cave,local_88,false,false);
      }
      pcVar9 = cave;
      if (cave != (chunk_conflict *)0x0) {
        if (p->cave != (chunk_conflict2 *)0x0) {
          if (0 < cave->height) {
            iVar6 = 0;
            do {
              if (0 < pcVar9->width) {
                iVar20 = 0;
                do {
                  lVar14 = (loc)loc(iVar20,iVar6);
                  for (obj = square_object(pcVar9,lVar14); obj != (object *)0x0; obj = obj->next) {
                    if (obj->artifact != (artifact *)0x0) {
                      _Var5 = obj_is_known_artifact(obj);
                      artifact = obj->artifact;
                      if (((p->opts).opt[0x23] != false) || (_Var5)) {
                        history_lose_artifact(p,artifact);
                        artifact = obj->artifact;
                        _Var5 = true;
                      }
                      else {
                        _Var5 = false;
                      }
                      mark_artifact_created(artifact,_Var5);
                    }
                  }
                  iVar20 = iVar20 + 1;
                } while (iVar20 < pcVar9->width);
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 < pcVar9->height);
          }
          cave_free((chunk_conflict *)p->cave);
          p->cave = (chunk_conflict2 *)0x0;
        }
        wipe_mon_list((chunk *)pcVar9,p);
        p->num_traps = '\0';
        cave_free(pcVar9);
        cave = (chunk_conflict *)0x0;
      }
    }
    else if ((cave->name == (char *)0x0) || (iVar6 = strcmp(cave->name,"arena"), iVar6 != 0)) {
      compact_monsters((chunk *)pcVar9,L'\0');
      if (p->upkeep->arena_level == false) {
        lVar14.x = (p->grid).x;
        lVar14.y = (p->grid).y;
        square_set_mon(cave,lVar14,L'\0');
      }
      cave_store((chunk *)cave,local_88,false,true);
      cave_store((chunk *)p->cave,local_88,true,true);
    }
    else if (p->place == 0) {
      p->upkeep->arena_level = false;
      if (p->last_place == 0) {
        p->last_place = p->home;
        cVar21 = (p->opts).opt[0x2a];
      }
      player_change_place(p,(int)p->last_place);
      ppVar3 = p->upkeep;
      ppVar3->arena_level = true;
      ppVar3->health_who = (monster *)0x0;
      pcVar8 = level_name(world->levels + p->last_place);
      my_strcpy(local_88,pcVar8,0x50);
      pcVar8 = level_name(world->levels + p->place);
      my_strcpy(local_d8,pcVar8,0x50);
    }
  }
  if (cVar21 == '\0') {
    height = L'\0';
    width = L'\0';
  }
  else {
    pcVar9 = chunk_find_name(local_d8);
    if ((pcVar9 != (chunk_conflict *)0x0) && (pcVar9 != cave)) {
      if (cave->name == (char *)0x0) {
        bVar23 = false;
      }
      else {
        iVar6 = strcmp(cave->name,"arena");
        bVar23 = iVar6 == 0;
      }
      pcVar8 = format("%s known");
      pcVar8 = string_make(pcVar8);
      pcVar12 = (chunk_conflict2 *)chunk_find_name(pcVar8);
      if (pcVar12 == (chunk_conflict2 *)0x0) {
        __assert_fail("old_known",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                      ,0x6df,"void prepare_next_level(struct player *)");
      }
      cave = pcVar9;
      p->cave = pcVar12;
      uVar1 = pcVar12->obj_max;
      if ((ulong)uVar1 != 0) {
        ppoVar2 = pcVar9->objects;
        uVar19 = 0;
        do {
          if ((ppoVar2[uVar19] != (object *)0x0) && (pcVar12->objects[uVar19] != (object *)0x0)) {
            ppoVar2[uVar19]->known = pcVar12->objects[uVar19];
          }
          uVar19 = uVar19 + 1;
        } while (uVar1 != uVar19);
      }
      restore_monsters();
      pcVar9 = cave;
      if (bVar23) {
        lVar13 = loc(0,0);
        _Var5 = loc_eq(p->old_grid,lVar13);
        if (!_Var5) {
          p->grid = p->old_grid;
          lVar13 = loc(0,0);
          p->old_grid = lVar13;
        }
        bVar23 = !_Var5;
        if ((!bVar23) && (0 < cave->height)) {
          iVar6 = 0;
          do {
            if (0 < cave->width) {
              iVar20 = 0;
              do {
                lVar14 = (loc)loc(iVar20,iVar6);
                psVar15 = square(cave,lVar14);
                if (psVar15->mon == -1) {
                  (p->grid).x = lVar14.x;
                  (p->grid).y = lVar14.y;
                  bVar23 = true;
                  break;
                }
                iVar20 = iVar20 + 1;
              } while (iVar20 < cave->width);
            }
          } while ((!bVar23) && (iVar6 = iVar6 + 1, iVar6 < cave->height));
        }
        if (!bVar23) {
          iVar6 = pcVar9->monsters[1].grid.x;
          iVar20 = pcVar9->monsters[1].grid.y;
          iVar16 = 1;
          do {
            y = iVar20 - iVar16;
            iVar7 = iVar20 + iVar16;
            if (y <= iVar7) {
              iVar17 = iVar6 - iVar16;
              iVar22 = iVar16 + iVar6;
              do {
                x = iVar17;
                if (iVar17 <= iVar22) {
                  do {
                    lVar14 = (loc)loc(x,y);
                    _Var5 = square_in_bounds_fully(pcVar9,lVar14);
                    if (((!_Var5) || (_Var5 = square_isempty(pcVar9,lVar14), !_Var5)) ||
                       (_Var5 = square_isvault(pcVar9,lVar14), _Var5)) {
                      bVar4 = false;
                    }
                    else {
                      (p->grid).x = lVar14.x;
                      (p->grid).y = lVar14.y;
                      bVar4 = true;
                      bVar23 = true;
                    }
                  } while ((x < iVar22) && (x = x + 1, !bVar4));
                }
              } while ((!bVar23) && (bVar4 = y < iVar7, y = y + 1, bVar4));
            }
          } while ((!bVar23) && (iVar16 = iVar16 + 1, iVar16 != 10));
        }
        if (!bVar23) {
          p->grid = pcVar9->monsters[1].grid;
          sanitize_player_loc((chunk *)pcVar9,p);
        }
        grid.x = (p->grid).x;
        grid.y = (p->grid).y;
        square_set_mon(pcVar9,grid,L'\xffffffff');
      }
      else {
        sanitize_player_loc((chunk *)cave,p);
        player_place((chunk_conflict2 *)cave,p,p->grid);
      }
      chunk_list_remove(local_d8);
      chunk_list_remove(pcVar8);
      string_free(pcVar8);
      goto LAB_0015fe5c;
    }
    if (p->upkeep->arena_level == true) {
      cave = (chunk_conflict *)cave_generate(p,L'\x06',L'\x06');
      event_signal_flag(EVENT_GEN_LEVEL_END,true);
      goto LAB_0015fe5c;
    }
    plVar10 = level_by_name(world,world->levels[p->place].up);
    height = L'\0';
    if (plVar10 == (level_conflict *)0x0) {
LAB_0015fbf7:
      width = L'\0';
    }
    else {
      pcVar8 = level_name(plVar10);
      pcVar9 = chunk_find_name(pcVar8);
      if (pcVar9 == (chunk_conflict *)0x0) goto LAB_0015fbf7;
      pcVar11 = pcVar9->join;
      width = L'\0';
      height = L'\0';
      if (pcVar11 != (connector *)0x0) {
        height = L'\0';
        width = L'\0';
        do {
          if (FEAT_MORE == (uint)pcVar11->feat) {
            wVar18 = (pcVar11->grid).y + L'\x02';
            if (height <= wVar18) {
              height = wVar18;
            }
            wVar18 = (pcVar11->grid).x + L'\x02';
            if (width <= wVar18) {
              width = wVar18;
            }
          }
          pcVar11 = pcVar11->next;
        } while (pcVar11 != (connector *)0x0);
      }
    }
    plVar10 = level_by_name(world,world->levels[p->place].down);
    if (plVar10 != (level_conflict *)0x0) {
      pcVar8 = level_name(plVar10);
      pcVar9 = chunk_find_name(pcVar8);
      if (pcVar9 != (chunk_conflict *)0x0) {
        for (pcVar11 = pcVar9->join; pcVar11 != (connector *)0x0; pcVar11 = pcVar11->next) {
          if (FEAT_LESS == (uint)pcVar11->feat) {
            wVar18 = (pcVar11->grid).y + L'\x02';
            if (height <= wVar18) {
              height = wVar18;
            }
            wVar18 = (pcVar11->grid).x + L'\x02';
            if (width <= wVar18) {
              width = wVar18;
            }
          }
        }
      }
    }
  }
  cave = (chunk_conflict *)cave_generate(p,height,width);
  event_signal_flag(EVENT_GEN_LEVEL_END,true);
LAB_0015fe5c:
  if ((p->depth == 0) || (p->place == 0)) {
    cave_known(p);
  }
  pcVar9 = cave;
  if (p->place == 0) {
    wiz_light((chunk *)cave,p,true);
  }
  else {
    _Var5 = is_daytime();
    cave_illuminate((chunk *)pcVar9,_Var5);
  }
  character_dungeon = true;
  return;
}

Assistant:

void prepare_next_level(struct player *p)
{
	bool persist = OPT(p, birth_levels_persist) || p->upkeep->arena_level;
	char prev_name[80];
	char new_name[80];

	my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
			  sizeof(prev_name));
	my_strcpy(new_name, level_name(&world->levels[p->place]), sizeof(new_name));

	/* Deal with any existing current level */
	if (character_dungeon) {
		assert (p->cave);

		if (persist) {
			/* Arenas don't get stored */
			if (!cave->name || !streq(cave->name, "arena")) {
				/* Tidy up */
				compact_monsters(cave, 0);
				if (!p->upkeep->arena_level) {
					/* Leave the player marker if going to an arena */
					square_set_mon(cave, p->grid, 0);
				}

				/* Save level and known level */
				cave_store(cave, prev_name, false, true);
				cave_store(p->cave, prev_name, true, true);
			} else if (!p->place) {
				/* Paranoia - try to catch unusual exits from Arena.  Ideally
				 * unusual exits never happen and this code is unnecessary */
				p->upkeep->arena_level = false;
				if (!p->last_place) {
					p->last_place = p->home; /* paranoia */
					persist = OPT(p, birth_levels_persist);
				}
				player_change_place(p, p->last_place);
				p->upkeep->arena_level = true;

				/* Suppress "defeated" message for unusual exit */
				p->upkeep->health_who = NULL;
				my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
				  sizeof(prev_name));
				my_strcpy(new_name, level_name(&world->levels[p->place]),
						  sizeof(new_name));
			}
		} else {
			/* Save the town */
			if (!cave->depth && !chunk_find_name(prev_name)) {
				cave_store(cave, prev_name, false, false);
			}

			/* Forget knowledge of old level */
			if (cave) {
				cave_clear(cave, p);
				cave = NULL;
			}
		}
	}

	/* Prepare the new level */
	if (persist) {
		/* Persistent levels need careful work */
		struct chunk *old_level = chunk_find_name(new_name);

		/* Check all the possibilities */
		if (old_level && (old_level != cave)) {
			/* We found an old level, load the known level and assign */
			int i;
			bool arena = cave->name && streq(cave->name, "arena");
			char *known_name = string_make(format("%s known", new_name));
			struct chunk *old_known = chunk_find_name(known_name);
			assert(old_known);

			/* Assign the new ones */
			cave = old_level;
			p->cave = old_known;

			/* Associate known objects */
			for (i = 0; i < p->cave->obj_max; i++) {
				if (cave->objects[i] && p->cave->objects[i]) {
					cave->objects[i]->known = p->cave->objects[i];
				}
			}

			/* Allow monsters to recover */
			restore_monsters();

			/* Leaving arenas requires special treatment */
			if (arena) {
				leave_arena(cave, p);
			} else {
				/* Map boundary changes may not cooperate with level teleport */
				sanitize_player_loc(cave, p);

				/* Place the player */
				player_place(cave, p, p->grid);
			}

			/* Remove from the list */
			chunk_list_remove(new_name);
			chunk_list_remove(known_name);
			string_free(known_name);
		} else if (p->upkeep->arena_level) {
			/* We're creating a new arena level */
			cave = cave_generate(p, 6, 6);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		} else {
			/* Creating a new level, make sure it joins existing ones right */
			struct level *lev;
			int min_height = 0, min_width = 0;

			/* Check level above */
			lev = level_by_name(world, world->levels[p->place].up);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, true);
				}
			}

			/* Check level below */
			lev = level_by_name(world, world->levels[p->place].down);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, false);
				}
			}

			/* Generate a new level */
			cave = cave_generate(p, min_height, min_width);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		}
	} else {
		/* Just generate a new level */
		cave = cave_generate(p, 0, 0);
		event_signal_flag(EVENT_GEN_LEVEL_END, true);
	}

	/* Know the town */
	if ((!(p->depth)) || (!(p->place))) {
		cave_known(p);
	}

	/* Apply illumination */
	if (p->place) cave_illuminate(cave, is_daytime());
	else wiz_light(cave, p, true);

	/* The dungeon is ready */
	character_dungeon = true;
}